

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::makeLargest(IEEEFloat *this,bool Negative)

{
  uint uVar1;
  uint uVar2;
  integerPart *__s;
  integerPart local_38;
  uint NumUnusedHighBits;
  uint PartCount;
  integerPart *significand;
  bool Negative_local;
  IEEEFloat *this_local;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  this->field_0x12 = this->field_0x12 & 0xf7 | Negative << 3;
  this->exponent = this->semantics->maxExponent;
  __s = significandParts(this);
  uVar1 = partCount(this);
  memset(__s,0xff,(ulong)(uVar1 - 1) << 3);
  uVar2 = uVar1 * 0x40 - this->semantics->precision;
  if (uVar2 < 0x40) {
    local_38 = 0xffffffffffffffff >> ((byte)uVar2 & 0x3f);
  }
  else {
    local_38 = 0;
  }
  __s[uVar1 - 1] = local_38;
  return;
}

Assistant:

void IEEEFloat::makeLargest(bool Negative) {
  // We want (in interchange format):
  //   sign = {Negative}
  //   exponent = 1..10
  //   significand = 1..1
  category = fcNormal;
  sign = Negative;
  exponent = semantics->maxExponent;

  // Use memset to set all but the highest integerPart to all ones.
  integerPart *significand = significandParts();
  unsigned PartCount = partCount();
  memset(significand, 0xFF, sizeof(integerPart)*(PartCount - 1));

  // Set the high integerPart especially setting all unused top bits for
  // internal consistency.
  const unsigned NumUnusedHighBits =
    PartCount*integerPartWidth - semantics->precision;
  significand[PartCount - 1] = (NumUnusedHighBits < integerPartWidth)
                                   ? (~integerPart(0) >> NumUnusedHighBits)
                                   : 0;
}